

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O0

bool __thiscall
lunasvg::SVGPatternElement::applyPaint(SVGPatternElement *this,SVGRenderState *state,float opacity)

{
  SVGPreserveAspectRatio *viewBoxRect_00;
  bool bVar1;
  Units UVar2;
  SVGPatternElement *this_00;
  SVGLength *pSVar3;
  Transform *pTVar4;
  Transform *transform;
  SVGPreserveAspectRatio *this_01;
  Canvas *this_02;
  element_type *source;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Rect RVar9;
  undefined1 auStack_1b8 [8];
  Transform patternTransform;
  shared_ptr<lunasvg::Canvas> local_198;
  undefined1 local_188 [8];
  SVGRenderState newState;
  Rect bbox_1;
  Transform local_130;
  SVGPreserveAspectRatio *local_118;
  SVGPreserveAspectRatio *preserveAspectRatio;
  Rect *viewBoxRect;
  undefined1 local_f8 [8];
  Transform patternImageTransform;
  shared_ptr<lunasvg::Canvas> patternImage;
  float yScale;
  float xScale;
  Transform currentTransform;
  Rect bbox;
  Rect patternRect;
  LengthContext lengthContext;
  SVGPatternElement *patternContentElement;
  SVGPatternAttributes attributes;
  float opacity_local;
  SVGRenderState *state_local;
  SVGPatternElement *this_local;
  
  attributes.m_patternContentElement._4_4_ = opacity;
  bVar1 = SVGRenderState::hasCycleReference(state,(SVGElement *)this);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    collectPatternAttributes((SVGPatternAttributes *)&patternContentElement,this);
    this_00 = SVGPatternAttributes::patternContentElement
                        ((SVGPatternAttributes *)&patternContentElement);
    if (this_00 == (SVGPatternElement *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      UVar2 = SVGPatternAttributes::patternUnits((SVGPatternAttributes *)&patternContentElement);
      LengthContext::LengthContext((LengthContext *)&patternRect.w,(SVGElement *)this,UVar2);
      pSVar3 = SVGPatternAttributes::x((SVGPatternAttributes *)&patternContentElement);
      fVar5 = LengthContext::valueForLength((LengthContext *)&patternRect.w,pSVar3);
      pSVar3 = SVGPatternAttributes::y((SVGPatternAttributes *)&patternContentElement);
      fVar6 = LengthContext::valueForLength((LengthContext *)&patternRect.w,pSVar3);
      pSVar3 = SVGPatternAttributes::width((SVGPatternAttributes *)&patternContentElement);
      fVar7 = LengthContext::valueForLength((LengthContext *)&patternRect.w,pSVar3);
      pSVar3 = SVGPatternAttributes::height((SVGPatternAttributes *)&patternContentElement);
      fVar8 = LengthContext::valueForLength((LengthContext *)&patternRect.w,pSVar3);
      Rect::Rect((Rect *)&bbox.w,fVar5,fVar6,fVar7,fVar8);
      UVar2 = SVGPatternAttributes::patternUnits((SVGPatternAttributes *)&patternContentElement);
      if (UVar2 == ObjectBoundingBox) {
        RVar9 = SVGRenderState::fillBoundingBox(state);
        bbox.x = RVar9.w;
        currentTransform.m_matrix.e = RVar9.x;
        bbox.w = bbox.w * bbox.x + currentTransform.m_matrix.e;
        bbox.y = RVar9.h;
        currentTransform.m_matrix.f = RVar9.y;
        bbox.h = bbox.h * bbox.y + currentTransform.m_matrix.f;
        patternRect.x = patternRect.x * bbox.x;
        patternRect.y = patternRect.y * bbox.y;
        currentTransform.m_matrix._16_8_ = RVar9._0_8_;
        bbox._0_8_ = RVar9._8_8_;
      }
      pTVar4 = SVGPatternAttributes::patternTransform
                         ((SVGPatternAttributes *)&patternContentElement);
      transform = SVGRenderState::currentTransform(state);
      Transform::operator*((Transform *)&yScale,pTVar4,transform);
      fVar5 = Transform::xScale((Transform *)&yScale);
      fVar6 = Transform::yScale((Transform *)&yScale);
      Canvas::create((Canvas *)&patternImageTransform.m_matrix.e,0.0,0.0,patternRect.x * fVar5,
                     patternRect.y * fVar6);
      Transform::scaled((Transform *)local_f8,fVar5,fVar6);
      preserveAspectRatio =
           (SVGPreserveAspectRatio *)
           SVGPatternAttributes::viewBox((SVGPatternAttributes *)&patternContentElement);
      bVar1 = Rect::isValid((Rect *)preserveAspectRatio);
      if (bVar1) {
        this_01 = SVGPatternAttributes::preserveAspectRatio
                            ((SVGPatternAttributes *)&patternContentElement);
        viewBoxRect_00 = preserveAspectRatio;
        local_118 = this_01;
        bbox_1._8_8_ = Rect::size((Rect *)&bbox.w);
        SVGPreserveAspectRatio::getTransform
                  (&local_130,this_01,(Rect *)viewBoxRect_00,(Size *)&bbox_1.w);
        Transform::multiply((Transform *)local_f8,&local_130);
      }
      else {
        UVar2 = SVGPatternAttributes::patternContentUnits
                          ((SVGPatternAttributes *)&patternContentElement);
        if (UVar2 == ObjectBoundingBox) {
          RVar9 = SVGRenderState::fillBoundingBox(state);
          newState.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = RVar9._0_8_;
          bbox_1.x = RVar9.w;
          fVar7 = bbox_1.x;
          bbox_1.y = RVar9.h;
          fVar8 = bbox_1.y;
          bbox_1._0_8_ = RVar9._8_8_;
          Transform::scale((Transform *)local_f8,fVar7,fVar8);
        }
      }
      std::shared_ptr<lunasvg::Canvas>::shared_ptr
                (&local_198,(shared_ptr<lunasvg::Canvas> *)&patternImageTransform.m_matrix.e);
      SVGRenderState::SVGRenderState
                ((SVGRenderState *)local_188,(SVGElement *)this,state,(Transform *)local_f8,Painting
                 ,&local_198);
      std::shared_ptr<lunasvg::Canvas>::~shared_ptr(&local_198);
      SVGElement::renderChildren((SVGElement *)this_00,(SVGRenderState *)local_188);
      pTVar4 = SVGPatternAttributes::patternTransform
                         ((SVGPatternAttributes *)&patternContentElement);
      patternTransform.m_matrix.c = (pTVar4->m_matrix).e;
      patternTransform.m_matrix.d = (pTVar4->m_matrix).f;
      auStack_1b8._0_4_ = (pTVar4->m_matrix).a;
      auStack_1b8._4_4_ = (pTVar4->m_matrix).b;
      patternTransform.m_matrix.a = (pTVar4->m_matrix).c;
      patternTransform.m_matrix.b = (pTVar4->m_matrix).d;
      Transform::translate((Transform *)auStack_1b8,bbox.w,bbox.h);
      Transform::scale((Transform *)auStack_1b8,1.0 / fVar5,1.0 / fVar6);
      this_02 = SVGRenderState::operator->(state);
      source = std::__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&patternImageTransform.m_matrix.e);
      Canvas::setTexture(this_02,source,Tiled,attributes.m_patternContentElement._4_4_,
                         (Transform *)auStack_1b8);
      this_local._7_1_ = true;
      SVGRenderState::~SVGRenderState((SVGRenderState *)local_188);
      std::shared_ptr<lunasvg::Canvas>::~shared_ptr
                ((shared_ptr<lunasvg::Canvas> *)&patternImageTransform.m_matrix.e);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SVGPatternElement::applyPaint(SVGRenderState& state, float opacity) const
{
    if(state.hasCycleReference(this))
        return false;
    auto attributes = collectPatternAttributes();
    auto patternContentElement = attributes.patternContentElement();
    if(patternContentElement == nullptr)
        return false;
    LengthContext lengthContext(this, attributes.patternUnits());
    Rect patternRect = {
        lengthContext.valueForLength(attributes.x()),
        lengthContext.valueForLength(attributes.y()),
        lengthContext.valueForLength(attributes.width()),
        lengthContext.valueForLength(attributes.height())
    };

    if(attributes.patternUnits() == Units::ObjectBoundingBox) {
        auto bbox = state.fillBoundingBox();
        patternRect.x = patternRect.x * bbox.w + bbox.x;
        patternRect.y = patternRect.y * bbox.h + bbox.y;
        patternRect.w = patternRect.w * bbox.w;
        patternRect.h = patternRect.h * bbox.h;
    }

    auto currentTransform = attributes.patternTransform() * state.currentTransform();
    auto xScale = currentTransform.xScale();
    auto yScale = currentTransform.yScale();

    auto patternImage = Canvas::create(0, 0, patternRect.w * xScale, patternRect.h * yScale);
    auto patternImageTransform = Transform::scaled(xScale, yScale);

    const auto& viewBoxRect = attributes.viewBox();
    if(viewBoxRect.isValid()) {
        const auto& preserveAspectRatio = attributes.preserveAspectRatio();
        patternImageTransform.multiply(preserveAspectRatio.getTransform(viewBoxRect, patternRect.size()));
    } else if(attributes.patternContentUnits() == Units::ObjectBoundingBox) {
        auto bbox = state.fillBoundingBox();
        patternImageTransform.scale(bbox.w, bbox.h);
    }

    SVGRenderState newState(this, &state, patternImageTransform, SVGRenderMode::Painting, patternImage);
    patternContentElement->renderChildren(newState);

    auto patternTransform = attributes.patternTransform();
    patternTransform.translate(patternRect.x, patternRect.y);
    patternTransform.scale(1.f / xScale, 1.f / yScale);
    state->setTexture(*patternImage, TextureType::Tiled, opacity, patternTransform);
    return true;
}